

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

void TTD::NSSnapValues::ParseSnapPrimitiveValue
               (SnapPrimitiveValue *snapValue,bool readSeparator,FileReader *reader,
               SlabAllocator *alloc,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *ptrIdToTypeMap)

{
  int iVar1;
  uint uVar2;
  TTD_PTR_ID TVar3;
  Entry *pEVar4;
  undefined4 extraout_var;
  uint64 uVar5;
  TTString *pTVar6;
  undefined7 in_register_00000031;
  double dVar7;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000031,readSeparator));
  TVar3 = FileReader::ReadAddr(reader,primitiveId,false);
  snapValue->PrimitiveValueId = TVar3;
  TVar3 = FileReader::ReadAddr(reader,typeId,true);
  pEVar4 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::FindSlotForId<false>
                     (ptrIdToTypeMap,TVar3);
  snapValue->SnapType = pEVar4->Data;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,0x19,1);
  if ((char)iVar1 != '\0') {
    (*reader->_vptr_FileReader[3])(reader,0x1a,1);
    iVar1 = (*reader->_vptr_FileReader[0x15])(reader,alloc,0);
    snapValue->OptWellKnownToken = (TTD_WELLKNOWN_TOKEN)CONCAT44(extraout_var,iVar1);
    (snapValue->field_3).u_int64Value = 0;
    goto switchD_0092b0a5_caseD_0;
  }
  snapValue->OptWellKnownToken = (TTD_WELLKNOWN_TOKEN)0x0;
  switch(snapValue->SnapType->JsTypeId) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    break;
  case TypeIds_Boolean:
    uVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
    uVar2 = uVar2 & 0xff;
    goto LAB_0092b0fd;
  default:
    TTDAbort_unrecoverable_error
              ("These are supposed to be primitive values e.g., no pointers or properties.");
  case TypeIds_Number:
    dVar7 = FileReader::ReadDouble(reader,doubleVal,true);
    (snapValue->field_3).u_doubleValue = dVar7;
    break;
  case TypeIds_Int64Number:
    uVar5 = FileReader::ReadInt64(reader,i64Val,true);
    goto LAB_0092b0e5;
  case TypeIds_LastNumberType:
    uVar5 = FileReader::ReadUInt64(reader,u64Val,true);
LAB_0092b0e5:
    (snapValue->field_3).u_uint64Value = uVar5;
    break;
  case TypeIds_String:
    pTVar6 = (TTString *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
    (snapValue->field_3).u_stringValue = pTVar6;
    (*reader->_vptr_FileReader[3])(reader,0x11,1);
    (*reader->_vptr_FileReader[0x13])(reader,alloc,pTVar6,0);
    break;
  case TypeIds_Symbol:
    uVar2 = FileReader::ReadInt32(reader,propertyId,true);
LAB_0092b0fd:
    (snapValue->field_3).u_boolValue = uVar2;
  }
switchD_0092b0a5_caseD_0:
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void ParseSnapPrimitiveValue(SnapPrimitiveValue* snapValue, bool readSeparator, FileReader* reader, SlabAllocator& alloc, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*>& ptrIdToTypeMap)
        {
            reader->ReadRecordStart(readSeparator);
            snapValue->PrimitiveValueId = reader->ReadAddr(NSTokens::Key::primitiveId);

            TTD_PTR_ID snapTypeId = reader->ReadAddr(NSTokens::Key::typeId, true);
            snapValue->SnapType = ptrIdToTypeMap.LookupKnownItem(snapTypeId);

            bool isWellKnown = reader->ReadBool(NSTokens::Key::isWellKnownToken, true);
            if(isWellKnown)
            {
                snapValue->OptWellKnownToken = reader->ReadWellKnownToken(NSTokens::Key::wellKnownToken, alloc, true);

                //just clear it to help avoid any confusion later
                snapValue->u_uint64Value = 0;
            }
            else
            {
                snapValue->OptWellKnownToken = nullptr;

                switch(snapValue->SnapType->JsTypeId)
                {
                case Js::TypeIds_Undefined:
                case Js::TypeIds_Null:
                    break;
                case Js::TypeIds_Boolean:
                    snapValue->u_boolValue = reader->ReadBool(NSTokens::Key::boolVal, true);
                    break;
                case Js::TypeIds_Number:
                    snapValue->u_doubleValue = reader->ReadDouble(NSTokens::Key::doubleVal, true);
                    break;
                case Js::TypeIds_Int64Number:
                    snapValue->u_int64Value = reader->ReadInt64(NSTokens::Key::i64Val, true);
                    break;
                case Js::TypeIds_UInt64Number:
                    snapValue->u_uint64Value = reader->ReadUInt64(NSTokens::Key::u64Val, true);
                    break;
                case Js::TypeIds_String:
                    snapValue->u_stringValue = alloc.SlabAllocateStruct<TTString>();
                    reader->ReadString(NSTokens::Key::stringVal, alloc, *(snapValue->u_stringValue), true);
                    break;
                case Js::TypeIds_Symbol:
                    snapValue->u_propertyIdValue = (Js::PropertyId)reader->ReadInt32(NSTokens::Key::propertyId, true);
                    break;
                default:
                    TTDAssert(false, "These are supposed to be primitive values e.g., no pointers or properties.");
                    break;
                }
            }

            reader->ReadRecordEnd();
        }